

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udf_json.cpp
# Opt level: O0

char * udf_json_get_value(UDF_INIT *initid,UDF_ARGS *args,char *result,unsigned_long *length,
                         char *is_null,char *error)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  char *__src;
  size_t *in_RCX;
  Json *in_RDX;
  long in_RSI;
  long in_RDI;
  size_t len;
  Json json;
  Json *in_stack_fffffffffffffe00;
  string *uri;
  string *content;
  Json *this;
  string local_1b8 [32];
  Json *in_stack_fffffffffffffe68;
  string local_178 [32];
  ulong local_158;
  undefined4 local_150;
  allocator local_149;
  string local_148 [16];
  Json *in_stack_fffffffffffffec8;
  undefined1 local_111 [233];
  size_t *local_28;
  Json *local_20;
  long local_18;
  long local_10;
  Json *local_8;
  
  if ((((**(int **)(in_RSI + 8) == 0) && (*(int *)(*(long *)(in_RSI + 8) + 4) == 0)) &&
      (**(long **)(in_RSI + 0x10) != 0)) && (*(long *)(*(long *)(in_RSI + 0x10) + 8) != 0)) {
    uri = (string *)**(undefined8 **)(in_RSI + 0x10);
    content = (string *)**(ulong **)(in_RSI + 0x18);
    this = (Json *)local_111;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_18 = in_RSI;
    local_10 = in_RDI;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_111 + 1),(char *)uri,(ulong)content,(allocator *)this);
    pcVar3 = *(char **)(*(long *)(local_18 + 0x10) + 8);
    uVar2 = *(ulong *)(*(long *)(local_18 + 0x18) + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,pcVar3,uVar2,&local_149);
    Json::Json(this,content,uri);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    std::__cxx11::string::~string((string *)(local_111 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_111);
    bVar1 = Json::IsValid(in_stack_fffffffffffffe68);
    if (bVar1) {
      Json::Str_abi_cxx11_(in_stack_fffffffffffffec8);
      uVar2 = std::__cxx11::string::size();
      std::__cxx11::string::~string(local_178);
      local_158 = uVar2;
      if (uVar2 < 0x100) {
        in_stack_fffffffffffffe00 = local_20;
        Json::Str_abi_cxx11_(in_stack_fffffffffffffec8);
        pcVar3 = (char *)std::__cxx11::string::c_str();
        strncpy((char *)in_stack_fffffffffffffe00,pcVar3,local_158);
        std::__cxx11::string::~string((string *)&stack0xfffffffffffffe68);
        *local_28 = local_158;
        local_8 = local_20;
      }
      else {
        pcVar3 = *(char **)(local_10 + 0x10);
        Json::Str_abi_cxx11_(in_stack_fffffffffffffec8);
        __src = (char *)std::__cxx11::string::c_str();
        strncpy(pcVar3,__src,local_158);
        std::__cxx11::string::~string(local_1b8);
        *(undefined1 *)(*(long *)(local_10 + 0x10) + (local_158 - 1)) = 0;
        local_8 = *(Json **)(local_10 + 0x10);
      }
    }
    else {
      local_8 = (Json *)0x0;
    }
    local_150 = 1;
    Json::~Json(in_stack_fffffffffffffe00);
  }
  else {
    local_8 = (Json *)0x0;
  }
  return (char *)local_8;
}

Assistant:

char* udf_json_get_value(UDF_INIT* initid, UDF_ARGS* args, char* result, unsigned long* length, char* is_null, char *error)
{
    if (args->arg_type[0] != STRING_RESULT
        || args->arg_type[1] != STRING_RESULT
        || args->args[0] == NULL
        || args->args[1] == NULL    )
    {
        return NULL;
    }

    Json json(std::string(args->args[0], args->lengths[0]), std::string(args->args[1], args->lengths[1]));
    if (!json.IsValid()) {
        return NULL;
    }
    size_t len = json.Str().size();
    if (len < 256) {
        strncpy(result, json.Str().c_str(), len);
        *length = len;
        return result;
    } else {
        strncpy(initid->ptr, json.Str().c_str(), len);
        initid->ptr[len - 1] = 0;
        return initid->ptr;
    }
}